

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_> * __thiscall
libtorrent::torrent_handle::file_status
          (vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  bool bVar1;
  storage_index_t sVar2;
  element_type *peVar3;
  session_impl *this_00;
  disk_interface *pdVar4;
  session_impl *ses;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    bVar1 = libtorrent::aux::torrent::has_storage(peVar3);
    if (bVar1) {
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      this_00 = (session_impl *)libtorrent::aux::torrent::session(peVar3);
      pdVar4 = libtorrent::aux::session_impl::disk_thread(this_00);
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      sVar2 = libtorrent::aux::torrent::storage(peVar3);
      (*pdVar4->_vptr_disk_interface[0xf])(__return_storage_ptr__,pdVar4,(ulong)sVar2.m_val);
      goto LAB_007053a6;
    }
  }
  memset(__return_storage_ptr__,0,0x18);
  ::std::vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>::vector
            (__return_storage_ptr__);
LAB_007053a6:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<open_file_state> torrent_handle::file_status() const
	{
		auto t = m_torrent.lock();
		if (!t || !t->has_storage()) return {};
		auto& ses = static_cast<session_impl&>(t->session());
		return ses.disk_thread().get_status(t->storage());
	}